

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O0

uchar * nvpair_unpack_string_array(_Bool isbe,nvpair_t *nvp,uchar *ptr,size_t *leftp)

{
  int *piVar1;
  size_t sVar2;
  void *__ptr;
  char *pcVar3;
  uint local_58;
  uint local_54;
  uint j;
  uint ii;
  char **value;
  char *tmp;
  size_t len;
  ssize_t size;
  size_t *leftp_local;
  uchar *ptr_local;
  nvpair_t *nvp_local;
  size_t *psStack_10;
  _Bool isbe_local;
  
  if (nvp->nvp_type != 10) {
    __assert_fail("nvp->nvp_type == 10",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                  ,0x3be,
                  "const unsigned char *nvpair_unpack_string_array(_Bool, nvpair_t *, const unsigned char *, size_t *)"
                 );
  }
  if (((*leftp < nvp->nvp_datasize) || (nvp->nvp_datasize == 0)) || (nvp->nvp_nitems == 0)) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    psStack_10 = (size_t *)0x0;
  }
  else {
    len = nvp->nvp_datasize;
    value = (char **)ptr;
    for (local_54 = 0; (ulong)local_54 < nvp->nvp_nitems; local_54 = local_54 + 1) {
      sVar2 = strnlen((char *)value,len - 1);
      len = len - (sVar2 + 1);
      if ((long)len < 0) {
        piVar1 = __errno_location();
        *piVar1 = 0x16;
        return (uchar *)0x0;
      }
      value = (char **)(sVar2 + 1 + (long)value);
    }
    if (len == 0) {
      __ptr = malloc(nvp->nvp_nitems << 3);
      if (__ptr == (void *)0x0) {
        psStack_10 = (size_t *)0x0;
      }
      else {
        leftp_local = (size_t *)ptr;
        for (local_54 = 0; (ulong)local_54 < nvp->nvp_nitems; local_54 = local_54 + 1) {
          pcVar3 = strdup((char *)leftp_local);
          *(char **)((long)__ptr + (ulong)local_54 * 8) = pcVar3;
          if (*(long *)((long)__ptr + (ulong)local_54 * 8) == 0) {
            for (local_58 = 0; local_58 < local_54; local_58 = local_58 + 1) {
              free(*(void **)((long)__ptr + (ulong)local_58 * 8));
            }
            free(__ptr);
            return (uchar *)0x0;
          }
          sVar2 = strlen(*(char **)((long)__ptr + (ulong)local_54 * 8));
          leftp_local = (size_t *)(sVar2 + 1 + (long)leftp_local);
          *leftp = *leftp - (sVar2 + 1);
        }
        nvp->nvp_data = (uint64_t)__ptr;
        psStack_10 = leftp_local;
      }
    }
    else {
      piVar1 = __errno_location();
      *piVar1 = 0x16;
      psStack_10 = (size_t *)0x0;
    }
  }
  return (uchar *)psStack_10;
}

Assistant:

const unsigned char *
nvpair_unpack_string_array(bool isbe __unused, nvpair_t *nvp,
    const unsigned char *ptr, size_t *leftp)
{
	ssize_t size;
	size_t len;
	const char *tmp;
	char **value;
	unsigned int ii, j;

	PJDLOG_ASSERT(nvp->nvp_type == NV_TYPE_STRING_ARRAY);

	if (*leftp < nvp->nvp_datasize || nvp->nvp_datasize == 0 ||
	    nvp->nvp_nitems == 0) {
		ERRNO_SET(EINVAL);
		return (NULL);
	}

	size = nvp->nvp_datasize;
	tmp = (const char *)ptr;
	for (ii = 0; ii < nvp->nvp_nitems; ii++) {
		len = strnlen(tmp, size - 1) + 1;
		size -= len;
		if (size < 0) {
			ERRNO_SET(EINVAL);
			return (NULL);
		}
		tmp += len;
	}
	if (size != 0) {
		ERRNO_SET(EINVAL);
		return (NULL);
	}

	value = nv_malloc(sizeof(*value) * nvp->nvp_nitems);
	if (value == NULL)
		return (NULL);

	for (ii = 0; ii < nvp->nvp_nitems; ii++) {
		value[ii] = nv_strdup((const char *)ptr);
		if (value[ii] == NULL)
			goto out;
		len = strlen(value[ii]) + 1;
		ptr += len;
		*leftp -= len;
	}
	nvp->nvp_data = (uint64_t)(uintptr_t)value;

	return (ptr);
out:
	for (j = 0; j < ii; j++)
		nv_free(value[j]);
	nv_free(value);
	return (NULL);
}